

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O1

void * tommy_tree_insert(tommy_tree *tree,tommy_tree_node *node,void *data)

{
  tommy_tree_node *ptVar1;
  long in_FS_OFFSET;
  tommy_tree_node *insert;
  tommy_tree_node *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  node->data = data;
  node->key = 0;
  node->next = (tommy_node_struct *)0x0;
  node->prev = (tommy_node_struct *)0x0;
  local_28 = node;
  ptVar1 = tommy_tree_insert_node(tree->cmp,tree->root,&local_28);
  tree->root = ptVar1;
  if (local_28 == node) {
    tree->count = tree->count + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return local_28->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_tree_insert(tommy_tree* tree, tommy_tree_node* node, void* data)
{
	tommy_tree_node* insert = node;

	insert->data = data;
	insert->prev = 0;
	insert->next = 0;
	insert->key = 0;

	tree->root = tommy_tree_insert_node(tree->cmp, tree->root, &insert);

	if (insert == node)
		++tree->count;

	return insert->data;
}